

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void compute_Zx_and_norm(update_data_conflict *data,float x,float *wref)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  
  uVar1 = data->ON->m;
  if (data->ON->normalize == true) {
    fVar4 = wref[(long)(int)uVar1 + 1];
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    x = x / fVar4;
  }
  uVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    data->Zx[uVar2 + 1] = wref[uVar2 + 1] * x * data->ON->D[uVar2 + 1] + data->Zx[uVar2 + 1];
  }
  data->norm2_x = x * x + data->norm2_x;
  return;
}

Assistant:

void compute_Zx_and_norm(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);

  for (int i = 1; i <= m; i++)
  {
    data.Zx[i] += w[i] * x * data.ON->D[i];
  }
  data.norm2_x += x * x;
}